

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O2

void __thiscall
de::AppendList<vk::DebugReportMessage>::append
          (AppendList<vk::DebugReportMessage> *this,DebugReportMessage *value)

{
  size_t *psVar1;
  size_t size;
  ulong uVar2;
  Block *this_00;
  ulong uVar3;
  Block *pBVar4;
  
  pBVar4 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar3 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar2 = uVar3 / this->m_blockSize;
  uVar3 = uVar3 % this->m_blockSize;
  while (pBVar4->blockNdx != uVar2) {
    if (pBVar4->next == (Block *)0x0) {
      deYield();
    }
    else {
      pBVar4 = pBVar4->next;
    }
  }
  size = uVar3 + 1;
  if (size == this->m_blockSize) {
    this_00 = (Block *)operator_new(0x18);
    Block::Block(this_00,uVar2 + 1,size);
    this->m_last = this_00;
    pBVar4->next = this_00;
  }
  ::vk::DebugReportMessage::DebugReportMessage(pBVar4->elements + uVar3,value);
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}